

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O3

void TestCipherAPI(EVP_CIPHER *cipher,Operation op,bool padding,bool copy,bool in_place,
                  bool use_evp_cipher,size_t chunk_size,Span<const_unsigned_char> key,
                  Span<const_unsigned_char> iv,Span<const_unsigned_char> plaintext,
                  Span<const_unsigned_char> ciphertext,Span<const_unsigned_char> aad,
                  Span<const_unsigned_char> tag)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  undefined1 auVar2 [8];
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Span<const_unsigned_char> *pSVar7;
  pointer *__ptr;
  long lVar8;
  AssertHelperData *__n;
  Bytes *this;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var9;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar10;
  undefined7 in_register_00000081;
  pointer pcVar11;
  char *message;
  undefined7 in_register_00000089;
  char *pcVar12;
  AssertHelperData *__n_00;
  int len;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  pointer local_90;
  _Head_base<0UL,_evp_cipher_ctx_st_*,_false> local_88;
  Bytes local_80;
  byte local_6d;
  int local_6c;
  AssertHelper local_68;
  uint local_5c;
  undefined4 local_58;
  uint32_t local_54;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  uint local_48;
  undefined4 local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  pcVar12 = (char *)CONCAT71(in_register_00000089,use_evp_cipher);
  local_58 = SUB84(pcVar12,0);
  local_44 = (undefined4)CONCAT71(in_register_00000081,in_place);
  uVar6 = EVP_CIPHER_flags((EVP_CIPHER *)cipher);
  pSVar7 = &ciphertext;
  if (op == kEncrypt) {
    pSVar7 = &plaintext;
  }
  local_50._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )pSVar7->data_;
  __n_00 = (AssertHelperData *)pSVar7->size_;
  pSVar7 = &plaintext;
  if (op == kEncrypt) {
    pSVar7 = &ciphertext;
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )pSVar7->data_;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar7->size_;
  local_54 = EVP_CIPHER_mode(cipher);
  local_88._M_head_impl = (evp_cipher_ctx_st *)EVP_CIPHER_CTX_new();
  local_a0[0] = (EVP_CIPHER_CTX *)local_88._M_head_impl != (EVP_CIPHER_CTX *)0x0;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((EVP_CIPHER_CTX *)local_88._M_head_impl == (EVP_CIPHER_CTX *)0x0) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)local_a0,(AssertionResult *)0x5203a5,"false","true",
               pcVar12);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x98,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
LAB_002415a9:
    pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_98;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]),local_c0._M_allocated_capacity + 1);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_e8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
    local_c8 = local_98;
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_002415ef;
  }
  else {
    pcVar12 = (char *)(ulong)(op == kEncrypt);
    iVar4 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)local_88._M_head_impl,(EVP_CIPHER *)cipher,
                              (ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0,(uint)(op == kEncrypt));
    local_a0[0] = iVar4 != 0;
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_a0,
                 (AssertionResult *)
                 "EVP_CipherInit_ex(ctx.get(), cipher, nullptr, nullptr, nullptr, encrypt ? 1 : 0)",
                 "false","true",pcVar12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x9b,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
      goto LAB_002415a9;
    }
    iVar4 = EVP_CIPHER_CTX_set_key_length((EVP_CIPHER_CTX *)local_88._M_head_impl,(int)key.size_);
    local_a0[0] = iVar4 != 0;
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_a0,
                 (AssertionResult *)"EVP_CIPHER_CTX_set_key_length(ctx.get(), key.size())","false",
                 "true",pcVar12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x9c,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
      goto LAB_002415a9;
    }
    if (!padding) {
      iVar4 = EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)local_88._M_head_impl,0);
      local_a0[0] = iVar4 != 0;
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d0,(internal *)local_a0,
                   (AssertionResult *)"EVP_CIPHER_CTX_set_padding(ctx.get(), 0)","false","true",
                   pcVar12);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x9e,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
        goto LAB_002415a9;
      }
    }
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar3 = MaybeCopyCipherContext(copy,(UniquePtr<EVP_CIPHER_CTX> *)&local_88);
    local_a0[0] = bVar3;
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar3) {
      testing::Message::Message((Message *)local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_a0,
                 (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",pcVar12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xa2,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
      goto LAB_002415a9;
    }
    pcVar12 = &DAT_ffffffff;
    iVar4 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)local_88._M_head_impl,(EVP_CIPHER *)0x0,
                              (ENGINE *)0x0,key.data_,(uchar *)0x0,-1);
    local_a0[0] = iVar4 != 0;
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_a0,
                 (AssertionResult *)
                 "EVP_CipherInit_ex(ctx.get(), nullptr, nullptr, key.data(), nullptr, -1)","false",
                 "true",pcVar12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xa5,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
      goto LAB_002415a9;
    }
    bVar3 = MaybeCopyCipherContext(copy,(UniquePtr<EVP_CIPHER_CTX> *)&local_88);
    local_a0[0] = bVar3;
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar3) {
      testing::Message::Message((Message *)local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d0,(internal *)local_a0,
                 (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",pcVar12);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xab,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
      goto LAB_002415a9;
    }
    if (local_54 == 6) {
      local_a0 = (undefined1  [8])iv.size_;
      local_e8 = (undefined1  [8])0x7fffffff;
      testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                ((internal *)local_d0,"iv.size()","size_t{2147483647}",(unsigned_long *)local_a0,
                 (unsigned_long *)local_e8);
      if (local_d0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_a0);
        if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = (local_c8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xad,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_a0);
      }
      else {
        if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c8,local_c8);
        }
        iVar4 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)local_88._M_head_impl,9,(int)iv.size_,
                                    (void *)0x0);
        local_a0[0] = iVar4 != 0;
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_d0,(internal *)local_a0,
                     (AssertionResult *)
                     "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x9, static_cast<int>(iv.size()), nullptr)",
                     "false","true",pcVar12);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0xaf,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
          goto LAB_002415a9;
        }
        iVar4 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)local_88._M_head_impl);
        local_e8._0_4_ = iVar4;
        local_a0 = (undefined1  [8])iv.size_;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_d0,"EVP_CIPHER_CTX_iv_length(ctx.get())","iv.size()",
                   (uint *)local_e8,(unsigned_long *)local_a0);
        if (local_d0[0] != (internal)0x0) goto LAB_002416b8;
        testing::Message::Message((Message *)local_a0);
        if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = (local_c8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xb0,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_a0);
      }
    }
    else {
      local_a0 = (undefined1  [8])iv.size_;
      iVar4 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)local_88._M_head_impl);
      local_e8._0_4_ = iVar4;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_d0,"iv.size()","EVP_CIPHER_CTX_iv_length(ctx.get())",
                 (unsigned_long *)local_a0,(uint *)local_e8);
      if (local_d0[0] != (internal)0x0) {
LAB_002416b8:
        if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c8,local_c8);
        }
        pcVar12 = &DAT_ffffffff;
        iVar4 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)local_88._M_head_impl,(EVP_CIPHER *)0x0,
                                  (ENGINE *)0x0,(uchar *)0x0,iv.data_,-1);
        local_a0[0] = iVar4 != 0;
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_d0,(internal *)local_a0,
                     (AssertionResult *)
                     "EVP_CipherInit_ex(ctx.get(), nullptr, nullptr, nullptr, iv.data(), -1)",
                     "false","true",pcVar12);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0xb6,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
          goto LAB_002415a9;
        }
        if (op != kEncrypt && local_54 == 6) {
          iVar4 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)local_88._M_head_impl,0x11,(int)tag.size_,
                                      tag.data_);
          local_a0[0] = iVar4 != 0;
          local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar4 == 0) {
            testing::Message::Message((Message *)local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_d0,(internal *)local_a0,
                       (AssertionResult *)
                       "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x11, tag.size(), const_cast<uint8_t *>(tag.data()))"
                       ,"false","true",pcVar12);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0xbb,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
            testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8)
            ;
            goto LAB_002415a9;
          }
        }
        local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_48 = (uint)copy;
        uVar6 = uVar6 >> 10 & 0x3fffff;
        local_5c = (uint)uVar6;
        local_6d = (byte)uVar6 & 1;
        _Var1._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
        for (; local_a0 = (undefined1  [8])_Var1._M_head_impl, aad.size_ != 0;
            aad.size_ = aad.size_ - uVar6) {
          uVar6 = chunk_size;
          if (aad.size_ < chunk_size) {
            uVar6 = aad.size_;
          }
          if (chunk_size == 0) {
            uVar6 = aad.size_;
          }
          uVar5 = (uint)uVar6;
          if ((char)local_58 == '\0') {
            iVar4 = EVP_CipherUpdate((EVP_CIPHER_CTX *)local_88._M_head_impl,(uchar *)0x0,
                                     (int *)&local_80,aad.data_,uVar5);
            auVar2 = local_a0;
            local_a0[0] = iVar4 != 0;
            local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar4 == 0) {
              testing::Message::Message((Message *)local_e8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_d0,(internal *)local_a0,
                         (AssertionResult *)
                         "EVP_CipherUpdate(ctx.get(), nullptr, &len, aad.data(), todo)","false",
                         "true",pcVar12);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_b0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xcc,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_b0,(Message *)local_e8);
              goto LAB_00241f4e;
            }
            local_a0._4_4_ = auVar2._4_4_;
            local_a0._0_4_ = uVar5;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_d0,"len","static_cast<int>(todo)",(int *)&local_80,
                       (int *)local_a0);
            if (local_d0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_a0);
              pcVar11 = "";
              if (local_c8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar11 = (local_c8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_e8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xcf,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_e8,(Message *)local_a0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
              if (local_a0 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_a0 + 8))();
              }
            }
          }
          else {
            local_a0._1_7_ = (undefined7)((ulong)_Var1._M_head_impl >> 8);
            local_a0[0] = local_6d;
            local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((local_5c & 1) == 0) {
              testing::Message::Message((Message *)local_e8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_d0,(internal *)local_a0,
                         (AssertionResult *)"is_custom_cipher","false","true",pcVar12);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_b0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,199,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_b0,(Message *)local_e8);
LAB_00241f4e:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                local_c0._M_allocated_capacity + 1);
              }
              if (local_e8 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_e8 + 8))();
              }
              if (local_98 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
              goto LAB_002415ef;
              pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_98;
              local_c8 = local_98;
              goto LAB_002415ea;
            }
            local_a0._4_4_ = (undefined4)((ulong)_Var1._M_head_impl >> 0x20);
            local_a0._0_4_ = uVar5;
            iVar4 = EVP_Cipher((EVP_CIPHER_CTX *)local_88._M_head_impl,(uchar *)0x0,aad.data_,uVar5)
            ;
            local_e8._0_4_ = iVar4;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_d0,"static_cast<int>(todo)",
                       "EVP_Cipher(ctx.get(), nullptr, aad.data(), todo)",(int *)local_a0,
                       (int *)local_e8);
            if (local_d0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_a0);
              if (local_c8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = (local_c8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_e8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xc9,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_e8,(Message *)local_a0);
              goto LAB_00242246;
            }
          }
          if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c8,local_c8);
          }
          aad.data_ = aad.data_ + uVar6;
          _Var1._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
        }
        uVar5 = EVP_CIPHER_CTX_block_size((EVP_CIPHER_CTX *)local_88._M_head_impl);
        __n = __n_00;
        if (((1 < uVar5) &&
            (uVar6 = EVP_CIPHER_CTX_flags((EVP_CIPHER_CTX *)local_88._M_head_impl),
            ((uint)uVar6 >> 0xb & 1) == 0)) &&
           (iVar4 = EVP_CIPHER_CTX_encrypting(local_88._M_head_impl), iVar4 != 0)) {
          __n = (AssertHelperData *)((long)__n_00 + ((ulong)uVar5 - (ulong)__n_00 % (ulong)uVar5));
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,(size_type)__n,
                   (allocator_type *)local_d0);
        if ((char)local_44 != '\0') {
          if (__n_00 != (AssertHelperData *)0x0) {
            memmove((void *)local_a0,
                    (void *)local_50._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,(size_t)__n_00);
          }
          local_50._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )local_a0;
          if ((AssertHelperData *)((long)local_98 - (long)local_a0) < __n_00) {
LAB_0024287c:
            abort();
          }
        }
        lVar8 = 0;
        if (__n_00 != (AssertHelperData *)0x0) {
          do {
            local_b0 = (undefined1  [8])chunk_size;
            if (__n_00 < chunk_size) {
              local_b0 = (undefined1  [8])__n_00;
            }
            if (chunk_size == 0) {
              local_b0 = (undefined1  [8])__n_00;
            }
            local_e8 = (undefined1  [8])0x7fffffff;
            testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                      ((internal *)local_d0,"todo","static_cast<size_t>(2147483647)",
                       (unsigned_long *)local_b0,(unsigned_long *)local_e8);
            if (local_d0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_e8);
              pcVar11 = "";
              if (local_c8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar11 = (local_c8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_80,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xe6,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_80,(Message *)local_e8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
              if (local_e8 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_e8 + 8))();
              }
            }
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
            bVar3 = MaybeCopyCipherContext(SUB41(local_48,0),(UniquePtr<EVP_CIPHER_CTX> *)&local_88)
            ;
            auVar2 = local_e8;
            local_e8[0] = bVar3;
            local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&local_80);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_d0,(internal *)local_e8,
                         (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",
                         pcVar12);
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xe7,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
LAB_002421c9:
              testing::internal::AssertHelper::~AssertHelper(&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                local_c0._M_allocated_capacity + 1);
              }
              if ((long *)local_80.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_80.span_.data_ + 8))();
              }
              if (local_e0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
              goto LAB_00242737;
              pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_e0;
              local_c8 = local_e0;
              goto LAB_00242732;
            }
            if ((char)local_58 != '\0') {
              if ((local_5c & 1) != 0) {
                local_6c = EVP_Cipher((EVP_CIPHER_CTX *)local_88._M_head_impl,
                                      (uchar *)((long)local_a0 + lVar8),
                                      (uchar *)local_50._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl,local_b0._0_4_);
                goto LAB_00241b5a;
              }
              local_e8._4_4_ = auVar2._4_4_;
              local_e8._0_4_ = 1;
              iVar4 = EVP_Cipher((EVP_CIPHER_CTX *)local_88._M_head_impl,
                                 (uchar *)((long)local_a0 + lVar8),
                                 (uchar *)local_50._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,local_b0._0_4_);
              local_80.span_.data_ = (uchar *)CONCAT44(local_80.span_.data_._4_4_,iVar4);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_d0,"1",
                         "EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo)",
                         (int *)local_e8,(int *)&local_80);
              if (local_d0[0] != (internal)0x0) {
                if (local_c8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_c8,local_c8);
                }
                local_6c = local_b0._0_4_;
                goto LAB_00241b5a;
              }
              testing::Message::Message((Message *)local_e8);
              if (local_c8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = (local_c8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_80,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xef,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_80,(Message *)local_e8);
LAB_00242664:
              this = &local_80;
              goto LAB_0024270f;
            }
            iVar4 = EVP_CipherUpdate((EVP_CIPHER_CTX *)local_88._M_head_impl,
                                     (uchar *)((long)local_a0 + lVar8),&local_6c,
                                     (uchar *)local_50._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl,local_b0._0_4_);
            local_e8[0] = iVar4 != 0;
            local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar4 == 0) {
              testing::Message::Message((Message *)&local_80);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_d0,(internal *)local_e8,
                         (AssertionResult *)
                         "EVP_CipherUpdate(ctx.get(), result.data() + total, &len, in.data(), static_cast<int>(todo))"
                         ,"false","true",pcVar12);
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xf4,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
              goto LAB_002421c9;
            }
LAB_00241b5a:
            local_e8 = (undefined1  [8])((ulong)local_e8 & 0xffffffff00000000);
            testing::internal::CmpHelperGE<int,int>
                      ((internal *)local_d0,"len","0",&local_6c,(int *)local_e8);
            if (local_d0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_e8);
              if (local_c8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = (local_c8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_80,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0xf6,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_80,(Message *)local_e8);
              goto LAB_00242664;
            }
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
            if (__n_00 < (ulong)local_b0) goto LAB_0024287c;
            local_50._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )((long)local_50._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + (long)local_b0);
            lVar8 = lVar8 + local_6c;
            __n_00 = (AssertHelperData *)((long)__n_00 - (long)local_b0);
          } while (__n_00 != (AssertHelperData *)0x0);
        }
        auVar2 = local_e8;
        if (op == kInvalidDecrypt) {
          if ((char)local_58 == '\0') {
            iVar4 = EVP_CipherFinal_ex((EVP_CIPHER_CTX *)local_88._M_head_impl,
                                       (uchar *)((long)local_a0 + lVar8),&local_6c);
            local_e8[0] = iVar4 == 0;
            local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar4 == 0) goto LAB_00242737;
            testing::Message::Message((Message *)local_b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_d0,(internal *)local_e8,
                       (AssertionResult *)
                       "EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len)","true","false",
                       pcVar12);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x103,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_80,(Message *)local_b0);
          }
          else {
            local_e8[0] = local_6d;
            local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((local_5c & 1) != 0) {
              local_e8._4_4_ = auVar2._4_4_;
              local_e8._0_4_ = 0xffffffff;
              iVar4 = EVP_Cipher((EVP_CIPHER_CTX *)local_88._M_head_impl,(uchar *)0x0,(uchar *)0x0,0
                                );
              local_b0._0_4_ = iVar4;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_d0,"-1","EVP_Cipher(ctx.get(), nullptr, nullptr, 0)",
                         (int *)local_e8,(int *)local_b0);
              if (local_d0[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_e8);
                if (local_c8 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar11 = "";
                }
                else {
                  pcVar11 = (local_c8->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0xff,pcVar11);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_b0,(Message *)local_e8);
                goto LAB_0024270a;
              }
              goto LAB_00242723;
            }
            testing::Message::Message((Message *)local_b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_d0,(internal *)local_e8,(AssertionResult *)"is_custom_cipher"
                       ,"false","true",pcVar12);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0xfe,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_80,(Message *)local_b0);
          }
LAB_002422d6:
          pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_e0;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_d0._1_7_,local_d0[0]),
                            local_c0._M_allocated_capacity + 1);
          }
          local_c8 = local_e0;
          if (local_b0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_b0 + 8))();
            local_c8 = local_e0;
          }
LAB_00242310:
          if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
LAB_00242732:
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()(pdVar10,local_c8);
          }
        }
        else {
          if ((char)local_58 == '\0') {
            iVar4 = EVP_CipherFinal_ex((EVP_CIPHER_CTX *)local_88._M_head_impl,
                                       (uchar *)((long)local_a0 + lVar8),&local_6c);
            local_e8[0] = iVar4 != 0;
            local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar4 == 0) {
              testing::Message::Message((Message *)local_b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_d0,(internal *)local_e8,
                         (AssertionResult *)
                         "EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len)","false","true"
                         ,pcVar12);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_80,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x10f,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_80,(Message *)local_b0);
              goto LAB_002422d6;
            }
          }
          else if ((local_5c & 1) == 0) {
            local_6c = 0;
          }
          else {
            local_6c = EVP_Cipher((EVP_CIPHER_CTX *)local_88._M_head_impl,(uchar *)0x0,(uchar *)0x0,
                                  0);
          }
          local_e8 = (undefined1  [8])((ulong)local_e8 & 0xffffffff00000000);
          testing::internal::CmpHelperGE<int,int>
                    ((internal *)local_d0,"len","0",&local_6c,(int *)local_e8);
          if (local_d0[0] != (internal)0x0) {
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,
                       lVar8 + local_6c);
            local_e8 = (undefined1  [8])
                       local_38._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
            local_e0 = local_40;
            local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)local_98 - (long)local_a0);
            local_b0 = local_a0;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)local_d0,"Bytes(expected)","Bytes(result)",(Bytes *)local_e8,
                       (Bytes *)local_b0);
            if (local_d0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_e8);
              if (local_c8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                message = "";
              }
              else {
                message = (local_c8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x114,message);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_b0,(Message *)local_e8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
              if (local_e8 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_e8 + 8))();
              }
            }
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
            if (op != kEncrypt || local_54 != 6) goto LAB_00242737;
            local_b0 = (undefined1  [8])tag.size_;
            local_80.span_.data_ = &DAT_00000010;
            testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                      ((internal *)local_d0,"tag.size()","sizeof(rtag)",(unsigned_long *)local_b0,
                       (unsigned_long *)&local_80);
            if (local_d0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_b0);
              if (local_c8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = (local_c8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_80,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x117,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_80,(Message *)local_b0);
LAB_00242788:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
              _Var9._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )local_b0;
              goto LAB_00242718;
            }
            if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,local_c8);
            }
            bVar3 = MaybeCopyCipherContext(SUB41(local_48,0),(UniquePtr<EVP_CIPHER_CTX> *)&local_88)
            ;
            local_b0[0] = bVar3;
            local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar3) {
              iVar4 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)local_88._M_head_impl,0x10,
                                          (int)tag.size_,local_e8);
              local_b0[0] = iVar4 != 0;
              local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar4 != 0) {
                local_b0 = (undefined1  [8])tag.data_;
                local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           tag.size_;
                local_80.span_.size_ = tag.size_;
                local_80.span_.data_ = local_e8;
                testing::internal::CmpHelperEQ<Bytes,Bytes>
                          ((internal *)local_d0,"Bytes(tag)","Bytes(rtag, tag.size())",
                           (Bytes *)local_b0,&local_80);
                if (local_d0[0] != (internal)0x0) goto LAB_00242723;
                testing::Message::Message((Message *)local_b0);
                if (local_c8 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar11 = "";
                }
                else {
                  pcVar11 = (local_c8->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                           ,0x11b,pcVar11);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_80,(Message *)local_b0);
                goto LAB_00242788;
              }
              testing::Message::Message((Message *)&local_80);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_d0,(internal *)local_b0,
                         (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x10, tag.size(), rtag)"
                         ,"false","true",pcVar12);
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x11a,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            }
            else {
              testing::Message::Message((Message *)&local_80);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_d0,(internal *)local_b0,
                         (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",
                         pcVar12);
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x118,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
            }
            pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_a8;
            testing::internal::AssertHelper::~AssertHelper(&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_d0._1_7_,local_d0[0]),
                              local_c0._M_allocated_capacity + 1);
            }
            local_c8 = local_a8;
            if ((long *)local_80.span_.data_ != (long *)0x0) {
              (**(code **)(*(long *)local_80.span_.data_ + 8))();
              local_c8 = local_a8;
            }
            goto LAB_00242310;
          }
          testing::Message::Message((Message *)local_e8);
          if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = "";
          }
          else {
            pcVar11 = (local_c8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x111,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_e8);
LAB_0024270a:
          this = (Bytes *)local_b0;
LAB_0024270f:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this);
          _Var9._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )local_e8;
LAB_00242718:
          if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )_Var9._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)_Var9._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
LAB_00242723:
          if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_c8;
            goto LAB_00242732;
          }
        }
LAB_00242737:
        if (local_a0 != (undefined1  [8])0x0) {
          operator_delete((void *)local_a0,(long)local_90 - (long)local_a0);
        }
        goto LAB_002415ef;
      }
      testing::Message::Message((Message *)local_a0);
      if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (local_c8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xb2,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_a0);
    }
LAB_00242246:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_002415ef;
    pdVar10 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_c8;
  }
LAB_002415ea:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar10,local_c8);
LAB_002415ef:
  std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)&local_88);
  return;
}

Assistant:

static void TestCipherAPI(const EVP_CIPHER *cipher, Operation op, bool padding,
                          bool copy, bool in_place, bool use_evp_cipher,
                          size_t chunk_size, bssl::Span<const uint8_t> key,
                          bssl::Span<const uint8_t> iv,
                          bssl::Span<const uint8_t> plaintext,
                          bssl::Span<const uint8_t> ciphertext,
                          bssl::Span<const uint8_t> aad,
                          bssl::Span<const uint8_t> tag) {
  bool encrypt = op == Operation::kEncrypt;
  bool is_custom_cipher =
      EVP_CIPHER_flags(cipher) & EVP_CIPH_FLAG_CUSTOM_CIPHER;
  bssl::Span<const uint8_t> in = encrypt ? plaintext : ciphertext;
  bssl::Span<const uint8_t> expected = encrypt ? ciphertext : plaintext;
  bool is_aead = EVP_CIPHER_mode(cipher) == EVP_CIPH_GCM_MODE;

  // Some |EVP_CIPHER|s take a variable-length key, and need to first be
  // configured with the key length, which requires configuring the cipher.
  bssl::UniquePtr<EVP_CIPHER_CTX> ctx(EVP_CIPHER_CTX_new());
  ASSERT_TRUE(ctx);
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), cipher, /*engine=*/nullptr,
                                /*key=*/nullptr, /*iv=*/nullptr,
                                encrypt ? 1 : 0));
  ASSERT_TRUE(EVP_CIPHER_CTX_set_key_length(ctx.get(), key.size()));
  if (!padding) {
    ASSERT_TRUE(EVP_CIPHER_CTX_set_padding(ctx.get(), 0));
  }

  // Configure the key.
  ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), /*cipher=*/nullptr,
                                /*engine=*/nullptr, key.data(), /*iv=*/nullptr,
                                /*enc=*/-1));

  // Configure the IV to run the actual operation. Callers that wish to use a
  // key for multiple, potentially concurrent, operations will likely copy at
  // this point. The |EVP_CIPHER_CTX| API uses the same type to represent a
  // pre-computed key schedule and a streaming operation.
  ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
  if (is_aead) {
    ASSERT_LE(iv.size(), size_t{INT_MAX});
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IVLEN,
                                    static_cast<int>(iv.size()), nullptr));
    ASSERT_EQ(EVP_CIPHER_CTX_iv_length(ctx.get()), iv.size());
  } else {
    ASSERT_EQ(iv.size(), EVP_CIPHER_CTX_iv_length(ctx.get()));
  }
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), /*cipher=*/nullptr,
                                /*engine=*/nullptr,
                                /*key=*/nullptr, iv.data(), /*enc=*/-1));

  if (is_aead && !encrypt) {
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_TAG,
                                    tag.size(),
                                    const_cast<uint8_t *>(tag.data())));
  }

  // Note: the deprecated |EVP_CIPHER|-based AEAD API is sensitive to whether
  // parameters are NULL, so it is important to skip the |in| and |aad|
  // |EVP_CipherUpdate| calls when empty.
  while (!aad.empty()) {
    size_t todo =
        chunk_size == 0 ? aad.size() : std::min(aad.size(), chunk_size);
    if (use_evp_cipher) {
      // AEADs always use the "custom cipher" return value convention. Passing a
      // null output pointer triggers the AAD logic.
      ASSERT_TRUE(is_custom_cipher);
      ASSERT_EQ(static_cast<int>(todo),
                EVP_Cipher(ctx.get(), nullptr, aad.data(), todo));
    } else {
      int len;
      ASSERT_TRUE(EVP_CipherUpdate(ctx.get(), nullptr, &len, aad.data(), todo));
      // Although it doesn't output anything, |EVP_CipherUpdate| should claim to
      // output the input length.
      EXPECT_EQ(len, static_cast<int>(todo));
    }
    aad = aad.subspan(todo);
  }

  // Set up the output buffer.
  size_t max_out = in.size();
  size_t block_size = EVP_CIPHER_CTX_block_size(ctx.get());
  if (block_size > 1 &&
      (EVP_CIPHER_CTX_flags(ctx.get()) & EVP_CIPH_NO_PADDING) == 0 &&
      EVP_CIPHER_CTX_encrypting(ctx.get())) {
    max_out += block_size - (max_out % block_size);
  }
  std::vector<uint8_t> result(max_out);
  if (in_place) {
    std::copy(in.begin(), in.end(), result.begin());
    in = bssl::Span(result).first(in.size());
  }

  size_t total = 0;
  int len;
  while (!in.empty()) {
    size_t todo = chunk_size == 0 ? in.size() : std::min(in.size(), chunk_size);
    EXPECT_LE(todo, static_cast<size_t>(INT_MAX));
    ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
    if (use_evp_cipher) {
      // |EVP_Cipher| sometimes returns the number of bytes written, or -1 on
      // error, and sometimes 1 or 0, implicitly writing |in_len| bytes.
      if (is_custom_cipher) {
        len = EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo);
      } else {
        ASSERT_EQ(
            1, EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo));
        len = static_cast<int>(todo);
      }
    } else {
      ASSERT_TRUE(EVP_CipherUpdate(ctx.get(), result.data() + total, &len,
                                   in.data(), static_cast<int>(todo)));
    }
    ASSERT_GE(len, 0);
    total += static_cast<size_t>(len);
    in = in.subspan(todo);
  }
  if (op == Operation::kInvalidDecrypt) {
    if (use_evp_cipher) {
      // Only the "custom cipher" return value convention can report failures.
      // Passing all nulls should act like |EVP_CipherFinal_ex|.
      ASSERT_TRUE(is_custom_cipher);
      EXPECT_EQ(-1, EVP_Cipher(ctx.get(), nullptr, nullptr, 0));
    } else {
      // Invalid padding and invalid tags all appear as a failed
      // |EVP_CipherFinal_ex|.
      EXPECT_FALSE(EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len));
    }
  } else {
    if (use_evp_cipher) {
      if (is_custom_cipher) {
        // Only the "custom cipher" convention has an |EVP_CipherFinal_ex|
        // equivalent.
        len = EVP_Cipher(ctx.get(), nullptr, nullptr, 0);
      } else {
        len = 0;
      }
    } else {
      ASSERT_TRUE(EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len));
    }
    ASSERT_GE(len, 0);
    total += static_cast<size_t>(len);
    result.resize(total);
    EXPECT_EQ(Bytes(expected), Bytes(result));
    if (encrypt && is_aead) {
      uint8_t rtag[16];
      ASSERT_LE(tag.size(), sizeof(rtag));
      ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
      ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_GET_TAG,
                                      tag.size(), rtag));
      EXPECT_EQ(Bytes(tag), Bytes(rtag, tag.size()));
    }
  }
}